

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O3

void __thiscall bandit::reporter::info::output_context_end_message(info *this)

{
  int iVar1;
  ostream *poVar2;
  _Elt_pointer pcVar3;
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar3 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar3 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar3 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  iVar1 = this->indentation_;
  this->indentation_ = iVar1 + -1;
  poVar2 = (this->super_colored_base).stm_;
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)iVar1 * '\x02' + -2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_88,local_80);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[4])(&local_48);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"end ",4);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_68);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,pcVar3[-1].desc._M_dataplus._M_p,pcVar3[-1].desc._M_string_length);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (0 < pcVar3[-1].total) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(&local_88);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_88,local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pcVar3[-1].total);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," total",6);
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
  }
  if (0 < pcVar3[-1].skipped) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[3])(&local_88);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_88,local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pcVar3[-1].skipped);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," skipped",8);
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
  }
  if (0 < pcVar3[-1].failed) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_88);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_88,local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pcVar3[-1].failed);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed",7);
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
  }
  poVar2 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_88);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_88,local_80);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

void output_context_end_message() {
        const context_info& context = context_stack_.top();
        --indentation_;
        stm_
            << indent()
            << colorizer_.info()
            << "end "
            << colorizer_.reset()
            << context.desc;
        if (context.total > 0) {
          stm_
              << colorizer_.emphasize()
              << " " << context.total << " total";
        }
        if (context.skipped > 0) {
          stm_
              << colorizer_.neutral()
              << " " << context.skipped << " skipped";
        }
        if (context.failed > 0) {
          stm_
              << colorizer_.bad()
              << " " << context.failed << " failed";
        }
        stm_ << colorizer_.reset() << std::endl;
      }